

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

pair<BigInteger,_BigInteger> *
ext_gcd(pair<BigInteger,_BigInteger> *__return_storage_ptr__,BigInteger *a,BigInteger *b)

{
  bool bVar1;
  bool bVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  bool bVar9;
  pointer puVar10;
  bool bVar11;
  pair<BigInteger,_BigInteger> *ppVar12;
  compare_t cVar13;
  compare_t cVar14;
  bool __tmp;
  BigInteger alpha;
  BigInteger beta;
  BigInteger local_118;
  BigInteger local_f8;
  BigInteger local_d8;
  BigInteger local_b8;
  BigInteger local_98;
  BigInteger local_78;
  pair<BigInteger,_BigInteger> *local_58;
  BigInteger local_50;
  
  BigInteger::BigInteger(&local_b8,1);
  local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_98.negative = false;
  local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_f8.negative = false;
  local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  BigInteger::BigInteger(&local_d8,1);
  while (((puVar3 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar3 || ((*puVar3 & 1) == 0)) &&
         ((puVar3 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar3 || ((*puVar3 & 1) == 0))))) {
    BigInteger::BigInteger(&local_78,2);
    BigInteger::operator/=(a,&local_78);
    if (local_78.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    BigInteger::BigInteger(&local_78,2);
    BigInteger::operator/=(b,&local_78);
    if (local_78.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78.digits,&a->digits);
  local_78.negative = a->negative;
  local_58 = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50.digits,&b->digits);
  local_50.negative = b->negative;
  while ((puVar3 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish == puVar3 || ((*puVar3 & 1) == 0))) {
    BigInteger::BigInteger(&local_118,2);
    BigInteger::operator/=(a,&local_118);
    if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (((local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) ||
        ((*local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start & 1) == 0)) &&
       ((puVar3 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar3 || ((*puVar3 & 1) == 0)))) {
      BigInteger::BigInteger(&local_118,2);
      BigInteger::operator/=(&local_b8,&local_118);
      if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      BigInteger::BigInteger(&local_118,2);
      BigInteger::operator/=(&local_98,&local_118);
    }
    else {
      BigInteger::operator+=(&local_b8,&local_50);
      BigInteger::BigInteger(&local_118,2);
      BigInteger::operator/=(&local_b8,&local_118);
      if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      BigInteger::operator-=(&local_98,&local_78);
      BigInteger::BigInteger(&local_118,2);
      BigInteger::operator/=(&local_98,&local_118);
    }
    if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  do {
    while( true ) {
      while( true ) {
        bVar1 = a->negative;
        bVar2 = b->negative;
        if ((bVar1 == bVar2) &&
           (cVar14 = BigInteger::_compareAbs(a,b), ppVar12 = local_58, cVar14 == CMP_EQUAL)) {
          std::pair<BigInteger,_BigInteger>::pair<BigInteger_&,_BigInteger_&,_true>
                    (local_58,&local_f8,&local_d8);
          if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_78.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          return ppVar12;
        }
        puVar3 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar4 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if ((puVar4 != puVar3) && ((*puVar3 & 1) != 0)) break;
        BigInteger::BigInteger(&local_118,2);
        BigInteger::operator/=(b,&local_118);
        if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((((pointer)CONCAT71(local_f8.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                local_f8.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_1_) ==
              local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start) ||
            ((*local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start & 1) == 0)) &&
           ((local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish ==
             local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start ||
            ((*local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start & 1) == 0)))) {
          BigInteger::BigInteger(&local_118,2);
          BigInteger::operator/=(&local_f8,&local_118);
          if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          BigInteger::BigInteger(&local_118,2);
          BigInteger::operator/=(&local_d8,&local_118);
        }
        else {
          BigInteger::operator+=(&local_f8,&local_50);
          BigInteger::BigInteger(&local_118,2);
          BigInteger::operator/=(&local_f8,&local_118);
          if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          BigInteger::operator-=(&local_d8,&local_78);
          BigInteger::BigInteger(&local_118,2);
          BigInteger::operator/=(&local_d8,&local_118);
        }
        if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (bVar2 == false) break;
      if (bVar1 != false) goto LAB_0012578b;
LAB_001257d6:
      bVar11 = local_98.negative;
      puVar10 = local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar9 = local_b8.negative;
      puVar8 = local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      puVar6 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = puVar3;
      (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = puVar6;
      (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
      (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar5;
      a->negative = bVar2;
      b->negative = bVar1;
      puVar3 = (pointer)CONCAT71(local_f8.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_f8.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._0_1_);
      puVar4 = (pointer)CONCAT71(local_f8.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_f8.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
      local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = puVar8;
      local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ =
           SUB81(local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,0);
      local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ =
           (undefined7)
           ((ulong)local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish >> 8);
      local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ =
           SUB81(local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ =
           (undefined7)
           ((ulong)local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage >> 8);
      local_b8.negative = local_f8.negative;
      local_f8.negative = bVar9;
      puVar6 = (pointer)CONCAT71(local_98.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_98.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
      local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ =
           SUB81(local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ =
           (undefined7)
           ((ulong)local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage >> 8);
      puVar5 = (pointer)CONCAT71(local_98.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_98.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._0_1_);
      local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ =
           SUB81(local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,0);
      local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ =
           (undefined7)
           ((ulong)local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish >> 8);
      local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = puVar10;
      local_98.negative = local_d8.negative;
      local_d8.negative = bVar11;
      local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar6;
      local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
      local_b8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar4;
    }
    if (bVar1 == false) {
LAB_0012578b:
      cVar13 = BigInteger::_compareAbs(b,a);
      cVar14 = -cVar13;
      if (bVar2 == false) {
        cVar14 = cVar13;
      }
      if (cVar14 == CMP_LESS) goto LAB_001257d6;
    }
    BigInteger::operator-=(b,a);
    BigInteger::operator-=(&local_f8,&local_b8);
    BigInteger::operator-=(&local_d8,&local_98);
  } while( true );
}

Assistant:

std::pair<BigInteger, BigInteger> ext_gcd(BigInteger a, BigInteger b)
{
    BigInteger u = 1, v = 0, s = 0, t = 1;
    while(!a.odd() && !b.odd())
    {
        a /= 2;
        b /= 2;
    }
    BigInteger alpha = a, beta = b;
    while(!a.odd())
    {
        a /= 2;
        if(!u.odd() && !b.odd())
        {
            u /= 2;
            v /= 2;
        }
        else
        {
            u += beta;
            u /= 2;
            v -= alpha;
            v /= 2;
        }
    }
    while(a != b)
    {
        if(!b.odd())
        {
            b /= 2;
            if(!s.odd() && !t.odd())
            {
                s /= 2;
                t /= 2;
            }
            else
            {
                s += beta;
                s /= 2;
                t -= alpha;
                t /= 2;
            }
        }
        else if(b < a)
        {
            a.swap(b);
            u.swap(s);
            v.swap(t);
        }
        else
        {
            b -= a;
            s -= u;
            t -= v;
        }
    }
    return {s, t};
}